

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

Var Js::JavascriptArray::ProfiledNewScFltArray
              (AuxArray<double> *doubles,ScriptContext *scriptContext,ArrayCallSiteInfo *arrayInfo,
              RecyclerWeakReference<Js::FunctionBody> *weakFuncRef)

{
  char *addr;
  double value;
  bool bVar1;
  uint uVar2;
  ThreadContext *pTVar3;
  SparseArraySegmentBase *pSVar4;
  code *pcVar5;
  bool bVar6;
  undefined4 *puVar7;
  Var pvVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  Type *addr_00;
  JavascriptNativeArray *local_60;
  uint local_4c;
  int32 ival;
  
  pTVar3 = scriptContext->threadContext;
  bVar1 = pTVar3->noJsReentrancy;
  pTVar3->noJsReentrancy = true;
  if ((((arrayInfo->field_0).bits & 2) != 0) ||
     (bVar6 = Phases::IsEnabled((Phases *)&DAT_015bbe90,NativeArrayPhase), bVar6)) {
    uVar2 = doubles->count;
    uVar10 = (ulong)uVar2;
    local_60 = (JavascriptNativeArray *)
               JavascriptLibrary::CreateArrayLiteral
                         ((scriptContext->super_ScriptContextBase).javascriptLibrary,uVar2);
    pSVar4 = (local_60->super_JavascriptArray).head.ptr;
    if ((uVar10 == 0) || (uVar2 != pSVar4->length)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x43e,"(count > 0 && count == head->length)",
                                  "count > 0 && count == head->length");
      if (!bVar6) {
LAB_00b7bd1d:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar7 = 0;
    }
    if (uVar10 != 0) {
      lVar11 = 0;
      lVar9 = 0;
      do {
        value = *(double *)((long)&doubles[1].count + lVar11);
        if ((value != (double)(int)value) || (NAN(value) || NAN((double)(int)value))) {
          bVar6 = false;
        }
        else {
          bVar6 = NumberUtilities::IsSpecial(value,0x8000000000000000);
          if (!bVar6) {
            local_4c = (int)value;
          }
          bVar6 = !bVar6;
        }
        if (bVar6) {
          addr_00 = (Type *)((long)&pSVar4[1].left + lVar11);
          Memory::Recycler::WBSetBit((char *)addr_00);
          *(ulong *)addr_00 = (ulong)local_4c | 0x1000000000000;
        }
        else {
          pvVar8 = JavascriptNumber::ToVarNoCheck(value,scriptContext);
          addr = (char *)((long)&pSVar4[1].left + lVar11);
          Memory::Recycler::WBSetBit(addr);
          addr_00 = &pSVar4[1].left + lVar9 * 2;
          *(Var *)addr = pvVar8;
        }
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
        lVar9 = lVar9 + 1;
        lVar11 = lVar11 + 8;
      } while (uVar10 << 3 != lVar11);
    }
  }
  else {
    ArrayCallSiteInfo::SetIsNotNativeIntArray(arrayInfo);
    uVar2 = doubles->count;
    local_60 = &JavascriptLibrary::CreateNativeFloatArrayLiteral
                          ((scriptContext->super_ScriptContextBase).javascriptLibrary,uVar2)->
                super_JavascriptNativeArray;
    pSVar4 = (local_60->super_JavascriptArray).head.ptr;
    if (((ulong)uVar2 == 0) || (uVar2 != pSVar4->length)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x434,"(count > 0 && count == head->length)",
                                  "count > 0 && count == head->length");
      if (!bVar6) goto LAB_00b7bd1d;
      *puVar7 = 0;
    }
    Memory::CopyArray<double,double,Memory::Recycler>
              ((double *)(pSVar4 + 1),(ulong)pSVar4->length,(double *)(doubles + 1),(ulong)uVar2);
    JavascriptNativeArray::SetArrayProfileInfo(local_60,weakFuncRef,arrayInfo);
  }
  pTVar3->noJsReentrancy = bVar1;
  return local_60;
}

Assistant:

Var JavascriptArray::ProfiledNewScFltArray(AuxArray<double> *doubles, ScriptContext* scriptContext, ArrayCallSiteInfo *arrayInfo, RecyclerWeakReference<FunctionBody> *weakFuncRef)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(ScrArr_ProfiledNewScFltArray, reentrancylock, scriptContext->GetThreadContext());
        // Called only to create array literals: size is known.
        if (arrayInfo->IsNativeFloatArray())
        {
            arrayInfo->SetIsNotNativeIntArray();
            uint32 count = doubles->count;
            JavascriptNativeFloatArray *arr = scriptContext->GetLibrary()->CreateNativeFloatArrayLiteral(count);
            SparseArraySegment<double> *head = SparseArraySegment<double>::From(arr->head);
            Assert(count > 0 && count == head->length);
            CopyArray(head->elements, head->length, doubles->elements, count);
            arr->SetArrayProfileInfo(weakFuncRef, arrayInfo);

            return arr;
        }

        uint32 count = doubles->count;
        JavascriptArray *arr = scriptContext->GetLibrary()->CreateArrayLiteral(count);
        SparseArraySegment<Var> *head = SparseArraySegment<Var>::From(arr->head);
        Assert(count > 0 && count == head->length);

        for (uint i = 0; i < count; i++)
        {
            double dval = doubles->elements[i];
            int32 ival;
            if (JavascriptNumber::TryGetInt32Value(dval, &ival) && !TaggedInt::IsOverflow(ival))
            {
                head->elements[i] = TaggedInt::ToVarUnchecked(ival);
            }
            else
            {
                head->elements[i] = JavascriptNumber::ToVarNoCheck(dval, scriptContext);
            }
        }

        return arr;
        JIT_HELPER_END(ScrArr_ProfiledNewScFltArray);
    }